

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# istack.c
# Opt level: O2

Bool prvTidyIsPushedLast(TidyDocImpl *doc,Node *element,Node *node)

{
  uint uVar1;
  Lexer *pLVar2;
  Bool BVar3;
  
  pLVar2 = doc->lexer;
  if ((((element == (Node *)0x0) || (BVar3 = IsNodePushable(element), BVar3 != no)) &&
      (uVar1 = pLVar2->istacksize, uVar1 != 0)) && (pLVar2->istack[uVar1 - 1].tag == node->tag)) {
    return yes;
  }
  return no;
}

Assistant:

Bool TY_(IsPushedLast)( TidyDocImpl* doc, Node *element, Node *node )
{
    Lexer* lexer = doc->lexer;

    if ( element && !IsNodePushable(element) )
        return no;

    if (lexer->istacksize > 0) {
        if (lexer->istack[lexer->istacksize - 1].tag == node->tag) {
            return yes;
        }
    }

    return no;
}